

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IrLoader::IrLoader(IrLoader *this,MessageConsumer *consumer,Module *m)

{
  allocator<char> local_21;
  Module *local_20;
  Module *m_local;
  MessageConsumer *consumer_local;
  IrLoader *this_local;
  
  this->consumer_ = consumer;
  this->module_ = m;
  local_20 = m;
  m_local = (Module *)consumer;
  consumer_local = (MessageConsumer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->source_,"<instruction>",&local_21);
  std::allocator<char>::~allocator(&local_21);
  this->inst_index_ = 0;
  std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>::
  unique_ptr<std::default_delete<spvtools::opt::Function>,void>
            ((unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>> *)
             &this->function_);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&this->block_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            (&this->dbg_line_info_);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&this->last_line_inst_);
  DebugScope::DebugScope(&this->last_dbg_scope_,0,0);
  this->extra_line_tracking_ = true;
  return;
}

Assistant:

IrLoader::IrLoader(const MessageConsumer& consumer, Module* m)
    : consumer_(consumer),
      module_(m),
      source_("<instruction>"),
      inst_index_(0),
      last_dbg_scope_(kNoDebugScope, kNoInlinedAt) {}